

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void av1_finalize_encoded_frame(AV1_COMP *cpi)

{
  RefCntBuffer *rhs_ptr;
  int iVar1;
  AV1_COMMON *cm_00;
  long in_RDI;
  int tile_idx;
  int tile_row;
  int tile_col;
  RefCntBuffer *frame_to_show;
  CurrentFrame *current_frame;
  AV1_COMMON *cm;
  int local_28;
  int local_24;
  AV1_COMMON *cm_01;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  cm_01 = cm_00;
  if ((*(char *)(*(long *)(in_RDI + 0x42008) + 0x3a) == '\0') &&
     (iVar1 = encode_show_existing_frame(cm_00), iVar1 != 0)) {
    rhs_ptr = cm_01->ref_frame_map[*(int *)(in_RDI + 0x9d1f0)];
    if (rhs_ptr == (RefCntBuffer *)0x0) {
      aom_internal_error(cm_01->error,AOM_CODEC_UNSUP_BITSTREAM,
                         "Buffer does not contain a reconstructed frame");
    }
    assign_frame_buffer_p(&cm_01->cur_frame,rhs_ptr);
  }
  iVar1 = encode_show_existing_frame(cm_01);
  if (((iVar1 == 0) && (cm_01->seq_params->film_grain_params_present != '\0')) &&
     ((cm_01->show_frame != 0 || (cm_01->showable_frame != 0)))) {
    memcpy(&cm_01->cur_frame->film_grain_params,&cm_01->film_grain_params,0x288);
    if ((cm_00->current_frame).frame_type != '\x01') {
      (cm_01->cur_frame->film_grain_params).update_parameters = 1;
    }
    (cm_01->film_grain_params).random_seed = (cm_01->film_grain_params).random_seed + 0xd35;
    if ((cm_01->film_grain_params).random_seed == 0) {
      (cm_01->film_grain_params).random_seed = 0x1cdf;
    }
  }
  for (local_24 = 0; local_24 < (cm_01->tiles).cols; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < (cm_01->tiles).rows; local_28 = local_28 + 1) {
      memcpy((void *)(*(long *)(in_RDI + 0x71318) +
                      (long)(local_28 * (cm_01->tiles).cols + local_24) * 0x5d10 + 0x20),cm_01->fc,
             0x52fc);
    }
  }
  iVar1 = frame_is_intra_only(cm_01);
  if (iVar1 == 0) {
    fix_interp_filter((InterpFilter *)cm_01,(FRAME_COUNTS *)cm_00);
  }
  return;
}

Assistant:

void av1_finalize_encoded_frame(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;

  if (!cm->seq_params->reduced_still_picture_hdr &&
      encode_show_existing_frame(cm)) {
    RefCntBuffer *const frame_to_show =
        cm->ref_frame_map[cpi->existing_fb_idx_to_show];

    if (frame_to_show == NULL) {
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Buffer does not contain a reconstructed frame");
    }
    assert(frame_to_show->ref_count > 0);
    assign_frame_buffer_p(&cm->cur_frame, frame_to_show);
  }

  if (!encode_show_existing_frame(cm) &&
      cm->seq_params->film_grain_params_present &&
      (cm->show_frame || cm->showable_frame)) {
    // Copy the current frame's film grain params to the its corresponding
    // RefCntBuffer slot.
    cm->cur_frame->film_grain_params = cm->film_grain_params;

    // We must update the parameters if this is not an INTER_FRAME
    if (current_frame->frame_type != INTER_FRAME)
      cm->cur_frame->film_grain_params.update_parameters = 1;

    // Iterate the random seed for the next frame.
    cm->film_grain_params.random_seed += 3381;
    if (cm->film_grain_params.random_seed == 0)
      cm->film_grain_params.random_seed = 7391;
  }

  // Initialise all tiles' contexts from the global frame context
  for (int tile_col = 0; tile_col < cm->tiles.cols; tile_col++) {
    for (int tile_row = 0; tile_row < cm->tiles.rows; tile_row++) {
      const int tile_idx = tile_row * cm->tiles.cols + tile_col;
      cpi->tile_data[tile_idx].tctx = *cm->fc;
    }
  }

  if (!frame_is_intra_only(cm))
    fix_interp_filter(&cm->features.interp_filter, cpi->td.counts);
}